

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_t __thiscall llvm::StringRef::find_lower(StringRef *this,char C,size_t From)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte bVar4;
  StringRef local_30;
  
  bVar4 = C | 0x20;
  if (0x19 < (byte)(C + 0xbfU)) {
    bVar4 = C;
  }
  sVar3 = this->Length - From;
  if (From <= this->Length) {
    local_30.Data = this->Data + From;
    while( true ) {
      if (sVar3 == 0) {
        return 0xffffffffffffffff;
      }
      local_30.Length = sVar3;
      bVar1 = front(&local_30);
      bVar2 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar2 = bVar1;
      }
      if (bVar2 == bVar4) {
        return this->Length - local_30.Length;
      }
      if (local_30.Length == 0) break;
      sVar3 = local_30.Length - 1;
      local_30.Data = local_30.Data + 1;
    }
  }
  __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
}

Assistant:

size_t StringRef::find_lower(char C, size_t From) const {
  char L = toLower(C);
  return find_if([L](char D) { return toLower(D) == L; }, From);
}